

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O1

array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> * __thiscall
jhu::thrax::fields(array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>
                   *__return_storage_ptr__,thrax *this,string_view line)

{
  void *pvVar1;
  thrax *ptVar2;
  ulong uVar3;
  invalid_argument *this_00;
  undefined8 uVar4;
  thrax *ptVar5;
  char *__s;
  size_type __n;
  thrax *ptVar6;
  size_type __n_1;
  ulong __n_00;
  
  __s = (char *)line._M_len;
  __return_storage_ptr__->_M_elems[2]._M_len = 0;
  __return_storage_ptr__->_M_elems[2]._M_str = (char *)0x0;
  __return_storage_ptr__->_M_elems[1]._M_len = 0;
  __return_storage_ptr__->_M_elems[1]._M_str = (char *)0x0;
  __return_storage_ptr__->_M_elems[0]._M_len = 0;
  __return_storage_ptr__->_M_elems[0]._M_str = (char *)0x0;
  if (this == (thrax *)0x0) {
    ptVar6 = (thrax *)0xffffffffffffffff;
  }
  else {
    pvVar1 = memchr(__s,9,(size_t)this);
    ptVar6 = (thrax *)(-(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)__s);
  }
  if (ptVar6 == (thrax *)0xffffffffffffffff) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"not enough fields");
  }
  else {
    ptVar2 = ptVar6;
    if (this < ptVar6) {
      ptVar2 = this;
    }
    __return_storage_ptr__->_M_elems[0]._M_len = (size_t)ptVar2;
    __return_storage_ptr__->_M_elems[0]._M_str = __s;
    ptVar2 = ptVar6 + 1;
    ptVar5 = (thrax *)0xffffffffffffffff;
    __n_00 = (long)this - (long)ptVar2;
    if (ptVar2 <= this && __n_00 != 0) {
      pvVar1 = memchr(__s + (long)ptVar2,9,__n_00);
      ptVar5 = (thrax *)(-(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)__s);
    }
    if (ptVar5 != (thrax *)0xffffffffffffffff) {
      if (ptVar6 < this) {
        uVar3 = (long)ptVar5 - (long)ptVar2;
        if (__n_00 < (ulong)((long)ptVar5 - (long)ptVar2)) {
          uVar3 = __n_00;
        }
        __return_storage_ptr__->_M_elems[1]._M_len = uVar3;
        __return_storage_ptr__->_M_elems[1]._M_str = (char *)(ptVar2 + (long)__s);
        ptVar2 = ptVar5 + 1;
        if (ptVar5 < this) {
          __return_storage_ptr__->_M_elems[2]._M_len = (long)this - (long)ptVar2;
          __return_storage_ptr__->_M_elems[2]._M_str = __s + (long)ptVar2;
          return __return_storage_ptr__;
        }
      }
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",ptVar2,this);
      __cxa_free_exception(this);
      _Unwind_Resume(uVar4);
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"not enough fields");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline auto fields(std::string_view line) {
  std::array<std::string_view, 3> result;
  auto tabPos = line.find('\t');
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[0] = line.substr(0, tabPos);
  auto start = tabPos + 1;
  tabPos = line.find('\t', start);
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[1] = line.substr(start, tabPos - start);
  result[2] = line.substr(tabPos + 1);
  return result;
}